

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O2

int ARKodeSetRelaxResTol(void *arkode_mem,sunrealtype res_tol)

{
  int iVar1;
  ARKodeRelaxMem relax_mem;
  ARKodeMem ark_mem;
  
  iVar1 = arkRelaxAccessMem(arkode_mem,"ARKodeSetRelaxResTol",&ark_mem,&relax_mem);
  if (iVar1 == 0) {
    if (ark_mem->step_supports_relaxation == 0) {
      iVar1 = -0x30;
      arkProcessError(ark_mem,-0x30,0x23e,"ARKodeSetRelaxResTol",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                      ,"time-stepping module does not support relaxation");
    }
    else {
      if (res_tol <= 0.0) {
        relax_mem->res_tol = 2.220446049250313e-15;
      }
      else {
        relax_mem->res_tol = res_tol;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKodeSetRelaxResTol(void* arkode_mem, sunrealtype res_tol)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRelaxMem relax_mem;

  retval = arkRelaxAccessMem(arkode_mem, __func__, &ark_mem, &relax_mem);
  if (retval) { return retval; }

  /* Guard against use for time steppers that do not allow relaxation */
  if (!ark_mem->step_supports_relaxation)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  if (res_tol > ZERO) { relax_mem->res_tol = res_tol; }
  else { relax_mem->res_tol = ARK_RELAX_DEFAULT_RES_TOL; }

  return ARK_SUCCESS;
}